

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O0

bool dxil_spv::value_is_wave_lane(Value *value)

{
  bool bVar1;
  int iVar2;
  Function *this;
  String *this_00;
  char *__s1;
  uint32_t local_24;
  CallInst *pCStack_20;
  uint32_t op;
  CallInst *dxil_op;
  Value *value_local;
  
  dxil_op = (CallInst *)value;
  pCStack_20 = LLVMBC::dyn_cast<LLVMBC::CallInst>(value);
  if (pCStack_20 == (CallInst *)0x0) {
    value_local._7_1_ = false;
  }
  else {
    this = LLVMBC::CallInst::getCalledFunction(pCStack_20);
    this_00 = LLVMBC::Function::getName_abi_cxx11_(this);
    __s1 = std::__cxx11::
           basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::data
                     (this_00);
    iVar2 = strncmp(__s1,"dx.op",5);
    if (iVar2 == 0) {
      bVar1 = get_constant_operand(&pCStack_20->super_Instruction,0,&local_24);
      if (bVar1) {
        value_local._7_1_ = local_24 == 0x6f;
      }
      else {
        value_local._7_1_ = false;
      }
    }
    else {
      value_local._7_1_ = false;
    }
  }
  return value_local._7_1_;
}

Assistant:

static bool value_is_wave_lane(const llvm::Value *value)
{
	auto *dxil_op = llvm::dyn_cast<llvm::CallInst>(value);
	if (!dxil_op)
		return false;
	if (strncmp(dxil_op->getCalledFunction()->getName().data(), "dx.op", 5) != 0)
		return false;

	uint32_t op;
	if (!get_constant_operand(dxil_op, 0, &op))
		return false;

	return DXIL::Op(op) == DXIL::Op::WaveGetLaneIndex;
}